

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::TestCaseBase
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,Context *context,char *name,
          char *description)

{
  tcu::TestCase::TestCase(&this->super_TestCase,context->m_testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01dd9790;
  this->context_id = context;
  this->program_object_id = 0;
  this->compute_shader_object_id = 0;
  this->fragment_shader_object_id = 0;
  this->geometry_shader_object_id = 0;
  this->geometry_shader_object_id = 0;
  this->tess_ctrl_shader_object_id = 0;
  this->tess_eval_shader_object_id = 0;
  this->vertex_shader_object_id = 0;
  return;
}

Assistant:

TestCaseBase<API>::TestCaseBase(Context& context, const char* name, const char* description)
	: tcu::TestCase(context.getTestContext(), name, description)
	, context_id(context)
	, program_object_id(0)
	, compute_shader_object_id(0)
	, fragment_shader_object_id(0)
	, geometry_shader_object_id(0)
	, tess_ctrl_shader_object_id(0)
	, tess_eval_shader_object_id(0)
	, vertex_shader_object_id(0)
{
	/* Left blank on purpose */
}